

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::LogSumExp::dim_forward
          (Dim *__return_storage_ptr__,LogSumExp *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ostream *os;
  invalid_argument *this_00;
  pointer pDVar4;
  ulong uVar5;
  Dim r_1;
  Dim local_1cc;
  Dim r;
  
  Dim::truncate(__return_storage_ptr__,
                (char *)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                        super__Vector_impl_data._M_start,(__off_t)xs);
  pDVar4 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 1;
  while( true ) {
    lVar3 = (long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pDVar4;
    if ((ulong)(lVar3 / 0x24) <= uVar5) {
      return __return_storage_ptr__;
    }
    r.d._0_8_ = *(undefined8 *)__return_storage_ptr__->d;
    r.d._8_8_ = *(undefined8 *)(__return_storage_ptr__->d + 2);
    r.d._16_8_ = *(undefined8 *)(__return_storage_ptr__->d + 4);
    r._24_8_ = *(undefined8 *)(__return_storage_ptr__->d + 6);
    r.bd = 1;
    Dim::truncate(&local_1cc,(char *)(pDVar4 + uVar5),lVar3 % 0x24);
    r_1.d[0] = local_1cc.d[0];
    r_1.d[1] = local_1cc.d[1];
    r_1.d[2] = local_1cc.d[2];
    r_1.d[3] = local_1cc.d[3];
    r_1.d[4] = local_1cc.d[4];
    r_1.d[5] = local_1cc.d[5];
    r_1.d[6] = local_1cc.d[6];
    r_1.nd = local_1cc.nd;
    r_1.bd = 1;
    bVar2 = operator!=(&r,&r_1);
    if (bVar2) break;
    pDVar4 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = __return_storage_ptr__->bd;
    if (__return_storage_ptr__->bd < pDVar4[uVar5].bd) {
      uVar1 = pDVar4[uVar5].bd;
    }
    uVar5 = (ulong)((int)uVar5 + 1);
    __return_storage_ptr__->bd = uVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
  os = std::operator<<((ostream *)&r,"Mismatched input dimensions in LogSumExp: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&r_1);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim LogSumExp::dim_forward(const vector<Dim>& xs) const {
  Dim d = xs[0].truncate();
  for (unsigned i = 1; i < xs.size(); ++i) {
    if (d.single_batch() != xs[i].truncate().single_batch()) {
      ostringstream s; s << "Mismatched input dimensions in LogSumExp: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(xs[i].bd, d.bd);
  }
  return d;
}